

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

int Vec_IntTwoFindCommon(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  long extraout_RAX;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int iVar5;
  Vec_Int_t *in_R8;
  int *piVar6;
  
  piVar6 = (int *)CONCAT71(in_register_00000009,in_CL);
  in_R8->nSize = 0;
  iVar5 = (int)vArr1;
  iVar3 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),0 < iVar5);
  if (0 < (int)vArr && 0 < iVar5) {
    piVar2 = &vArr2->nCap;
    lVar4 = (long)(int)vArr;
    piVar1 = piVar6 + lVar4;
    do {
      iVar3 = vArr2->nCap;
      if (iVar3 == *piVar6) {
        Vec_IntPush(in_R8,iVar3);
        vArr2 = (Vec_Int_t *)&vArr2->nSize;
        lVar4 = extraout_RAX;
LAB_0079a63a:
        piVar6 = piVar6 + 1;
      }
      else {
        if (*piVar6 <= iVar3) goto LAB_0079a63a;
        vArr2 = (Vec_Int_t *)&vArr2->nSize;
      }
      iVar3 = (int)lVar4;
    } while ((vArr2 < (Vec_Int_t *)(piVar2 + iVar5)) && (piVar6 < piVar1));
  }
  return iVar3;
}

Assistant:

static inline int Vec_IntTwoFindCommon( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    Vec_IntClear( vArr );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            Vec_IntPush( vArr, *pBeg1 ), pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            pBeg1++;
        else 
            pBeg2++;
    }
    return Vec_IntSize(vArr);
}